

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O0

int compare_strings(uchar *string1,uchar *string2,cJSON_bool case_sensitive)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  byte *in_RSI;
  byte *in_RDI;
  byte *local_18;
  byte *local_10;
  int local_4;
  
  if ((in_RDI == (byte *)0x0) || (in_RSI == (byte *)0x0)) {
    local_4 = 1;
  }
  else if (in_RDI == in_RSI) {
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    if (in_EDX == 0) {
      while( true ) {
        iVar1 = tolower((uint)*local_10);
        iVar2 = tolower((uint)*local_18);
        if (iVar1 != iVar2) break;
        if (*local_10 == 0) {
          return 0;
        }
        local_10 = local_10 + 1;
        local_18 = local_18 + 1;
      }
      local_4 = tolower((uint)*local_10);
      iVar1 = tolower((uint)*local_18);
      local_4 = local_4 - iVar1;
    }
    else {
      local_4 = strcmp((char *)in_RDI,(char *)in_RSI);
    }
  }
  return local_4;
}

Assistant:

static int compare_strings(const unsigned char *string1, const unsigned char *string2, const cJSON_bool case_sensitive)
{
    if ((string1 == NULL) || (string2 == NULL))
    {
        return 1;
    }

    if (string1 == string2)
    {
        return 0;
    }

    if (case_sensitive)
    {
        return strcmp((const char*)string1, (const char*)string2);
    }

    for(; tolower(*string1) == tolower(*string2); (void)string1++, string2++)
    {
        if (*string1 == '\0')
        {
            return 0;
        }
    }

    return tolower(*string1) - tolower(*string2);
}